

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

void entityDeclDebug(void *ctx,xmlChar *name,int type,xmlChar *publicId,xmlChar *systemId,
                    xmlChar *content)

{
  if (publicId == (xmlChar *)0x0) {
    publicId = (xmlChar *)"(null)";
  }
  if (systemId == (xmlChar *)0x0) {
    systemId = (xmlChar *)"(null)";
  }
  if (content == (xmlChar *)0x0) {
    content = (xmlChar *)"(null)";
  }
  callbacks = callbacks + 1;
  fprintf((FILE *)SAXdebug,"SAX.entityDecl(%s, %d, %s, %s, %s)\n",name,type,publicId,systemId,
          content);
  return;
}

Assistant:

static void
entityDeclDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *name, int type,
          const xmlChar *publicId, const xmlChar *systemId, xmlChar *content)
{
const xmlChar *nullstr = BAD_CAST "(null)";
    /* not all libraries handle printing null pointers nicely */
    if (publicId == NULL)
        publicId = nullstr;
    if (systemId == NULL)
        systemId = nullstr;
    if (content == NULL)
        content = (xmlChar *)nullstr;
    callbacks++;
    if (quiet)
	return;
    fprintf(SAXdebug, "SAX.entityDecl(%s, %d, %s, %s, %s)\n",
            name, type, publicId, systemId, content);
}